

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbTest.c
# Opt level: O2

Gia_Man_t * Acb_NtkGiaDeriveMiter(Gia_Man_t *pOne,Gia_Man_t *pTwo,int Type)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Gia_Man_t *p;
  char *pcVar5;
  Gia_Obj_t *pGVar6;
  Gia_Obj_t *pGVar7;
  Gia_Man_t *pGVar8;
  int iVar9;
  int pLitsS [2];
  int pLitsF [2];
  
  if (pOne->vCis->nSize != pTwo->vCis->nSize) {
    __assert_fail("Gia_ManCiNum(pOne) == Gia_ManCiNum(pTwo)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbTest.c"
                  ,400,"Gia_Man_t *Acb_NtkGiaDeriveMiter(Gia_Man_t *, Gia_Man_t *, int)");
  }
  iVar9 = pOne->vCos->nSize;
  if (iVar9 == pTwo->vCos->nSize) {
    p = Gia_ManStart((iVar9 * 5) / 2 + pOne->nObjs + pTwo->nObjs);
    pcVar5 = Abc_UtilStrsav("miter");
    p->pName = pcVar5;
    p->pSpec = (char *)0x0;
    Gia_ManHashAlloc(p);
    pOne->pObjs->Value = 0;
    pTwo->pObjs->Value = 0;
    iVar9 = 0;
    while ((iVar9 < pOne->vCis->nSize &&
           (pGVar6 = Gia_ManCi(pOne,iVar9), pGVar6 != (Gia_Obj_t *)0x0))) {
      uVar2 = Gia_ManAppendCi(p);
      pGVar6->Value = uVar2;
      iVar9 = iVar9 + 1;
    }
    iVar9 = 0;
    while ((iVar9 < pTwo->vCis->nSize &&
           (pGVar6 = Gia_ManCi(pTwo,iVar9), pGVar6 != (Gia_Obj_t *)0x0))) {
      pGVar7 = Gia_ManCi(pOne,iVar9);
      pGVar6->Value = pGVar7->Value;
      iVar9 = iVar9 + 1;
    }
    iVar9 = 0;
    while ((iVar9 < pOne->nObjs && (pGVar6 = Gia_ManObj(pOne,iVar9), pGVar6 != (Gia_Obj_t *)0x0))) {
      if ((~*(uint *)pGVar6 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar6) {
        iVar3 = Gia_ObjFanin0Copy(pGVar6);
        iVar4 = Gia_ObjFanin1Copy(pGVar6);
        uVar2 = Gia_ManHashAnd(p,iVar3,iVar4);
        pGVar6->Value = uVar2;
      }
      iVar9 = iVar9 + 1;
    }
    iVar9 = 0;
    while ((iVar9 < pTwo->nObjs && (pGVar6 = Gia_ManObj(pTwo,iVar9), pGVar6 != (Gia_Obj_t *)0x0))) {
      if ((~*(uint *)pGVar6 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar6) {
        iVar3 = Gia_ObjFanin0Copy(pGVar6);
        iVar4 = Gia_ObjFanin1Copy(pGVar6);
        uVar2 = Gia_ManHashAnd(p,iVar3,iVar4);
        pGVar6->Value = uVar2;
      }
      iVar9 = iVar9 + 1;
    }
    iVar9 = 0;
    while ((iVar9 < pOne->vCos->nSize &&
           (pGVar6 = Gia_ManCo(pOne,iVar9), pGVar6 != (Gia_Obj_t *)0x0))) {
      uVar2 = Gia_ObjFanin0Copy(pGVar6);
      pGVar6->Value = uVar2;
      iVar9 = iVar9 + 1;
    }
    iVar9 = 0;
    while ((iVar9 < pTwo->vCos->nSize &&
           (pGVar6 = Gia_ManCo(pTwo,iVar9), pGVar6 != (Gia_Obj_t *)0x0))) {
      uVar2 = Gia_ObjFanin0Copy(pGVar6);
      pGVar6->Value = uVar2;
      iVar9 = iVar9 + 1;
    }
    if (Type == 0) {
      for (; Type < pOne->vCos->nSize; Type = Type + 2) {
        pGVar6 = Gia_ManCo(pOne,Type);
        uVar2 = pGVar6->Value;
        Gia_ManCo(pOne,Type + 1);
        pGVar6 = Gia_ManCo(pTwo,Type);
        uVar1 = pGVar6->Value;
        Gia_ManCo(pTwo,Type + 1);
        Gia_ManAppendCo(p,uVar2);
        Gia_ManAppendCo(p,uVar1);
      }
    }
    else {
      iVar9 = 0;
      if (Type == 1) {
        for (; iVar9 < pOne->vCos->nSize; iVar9 = iVar9 + 2) {
          Gia_ManCo(pOne,iVar9);
          pGVar6 = Gia_ManCo(pOne,iVar9 + 1);
          uVar2 = pGVar6->Value;
          Gia_ManCo(pTwo,iVar9);
          pGVar6 = Gia_ManCo(pTwo,iVar9 + 1);
          uVar1 = pGVar6->Value;
          Gia_ManAppendCo(p,uVar2);
          Gia_ManAppendCo(p,uVar1);
        }
      }
      else {
        for (; iVar9 < pOne->vCos->nSize; iVar9 = iVar9 + 2) {
          pGVar6 = Gia_ManCo(pOne,iVar9);
          pLitsF[0] = pGVar6->Value;
          pGVar6 = Gia_ManCo(pOne,iVar9 + 1);
          pLitsF[1] = pGVar6->Value;
          pGVar6 = Gia_ManCo(pTwo,iVar9);
          pLitsS[0] = pGVar6->Value;
          pGVar6 = Gia_ManCo(pTwo,iVar9 + 1);
          pLitsS[1] = pGVar6->Value;
          iVar3 = Gia_ManDualCompare(p,pLitsF,pLitsS);
          Gia_ManAppendCo(p,iVar3);
        }
      }
    }
    Gia_ManHashStop(p);
    pGVar8 = Gia_ManCleanup(p);
    Gia_ManStop(p);
    return pGVar8;
  }
  __assert_fail("Gia_ManCoNum(pOne) == Gia_ManCoNum(pTwo)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbTest.c"
                ,0x191,"Gia_Man_t *Acb_NtkGiaDeriveMiter(Gia_Man_t *, Gia_Man_t *, int)");
}

Assistant:

Gia_Man_t * Acb_NtkGiaDeriveMiter( Gia_Man_t * pOne, Gia_Man_t * pTwo, int Type )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i;
    assert( Gia_ManCiNum(pOne) == Gia_ManCiNum(pTwo) );
    assert( Gia_ManCoNum(pOne) == Gia_ManCoNum(pTwo) );
    pNew = Gia_ManStart( Gia_ManObjNum(pOne) + Gia_ManObjNum(pTwo) + 5*Gia_ManCoNum(pOne)/2 );
    pNew->pName = Abc_UtilStrsav( "miter" );
    pNew->pSpec = NULL;
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(pOne)->Value = 0;
    Gia_ManConst0(pTwo)->Value = 0;
    Gia_ManForEachCi( pOne, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachCi( pTwo, pObj, i )
        pObj->Value = Gia_ManCi(pOne, i)->Value;
    Gia_ManForEachAnd( pOne, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachAnd( pTwo, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( pOne, pObj, i )
        pObj->Value = Gia_ObjFanin0Copy(pObj);
    Gia_ManForEachCo( pTwo, pObj, i )
        pObj->Value = Gia_ObjFanin0Copy(pObj);
    if ( Type == 0 ) // only main circuit
    {
        for ( i = 0; i < Gia_ManCoNum(pOne); i += 2 )
        {
            int pLitsF[2] = { Gia_ManCo(pOne, i)->Value, Gia_ManCo(pOne, i+1)->Value };
            int pLitsS[2] = { Gia_ManCo(pTwo, i)->Value, Gia_ManCo(pTwo, i+1)->Value };
            Gia_ManAppendCo( pNew, pLitsF[0] );
            Gia_ManAppendCo( pNew, pLitsS[0] );
        }
    }
    else if ( Type == 1 ) // only shadow circuit
    {
        for ( i = 0; i < Gia_ManCoNum(pOne); i += 2 )
        {
            int pLitsF[2] = { Gia_ManCo(pOne, i)->Value, Gia_ManCo(pOne, i+1)->Value };
            int pLitsS[2] = { Gia_ManCo(pTwo, i)->Value, Gia_ManCo(pTwo, i+1)->Value };
            Gia_ManAppendCo( pNew, pLitsF[1] );
            Gia_ManAppendCo( pNew, pLitsS[1] );
        }
    }
    else // comparator of the two
    {
        for ( i = 0; i < Gia_ManCoNum(pOne); i += 2 )
        {
            int pLitsF[2] = { Gia_ManCo(pOne, i)->Value, Gia_ManCo(pOne, i+1)->Value };
            int pLitsS[2] = { Gia_ManCo(pTwo, i)->Value, Gia_ManCo(pTwo, i+1)->Value };
            Gia_ManAppendCo( pNew, Gia_ManDualCompare( pNew, pLitsF, pLitsS ) );
        }
    }
    Gia_ManHashStop( pNew );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}